

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_monitor.cpp
# Opt level: O0

void __thiscall r_exec::GMonitor::commit(GMonitor *this)

{
  bool bVar1;
  _Fact *this_00;
  Goal *this_01;
  Goal *pGVar2;
  long lVar3;
  reference ppVar4;
  Sim *pSVar5;
  PrimaryMDLController *pPVar6;
  HLPBindingMap *pHVar7;
  Fact *pFVar8;
  float fVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  iterator local_c0;
  _List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_> local_b8;
  iterator local_b0;
  _List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_> local_a8;
  double local_a0;
  double _s;
  double s;
  _List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_> local_88;
  iterator local_80;
  _List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_> local_78;
  Sim *local_70;
  Sim *best_sol;
  _List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_> local_60;
  iterator local_58;
  _List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_> local_50;
  iterator local_48;
  _List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_> local_40;
  iterator local_38;
  _List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_> local_30;
  _List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_> local_28;
  const_iterator sol;
  uint64_t now;
  Goal *monitored_goal;
  GMonitor *this_local;
  
  this_00 = &core::P<r_exec::Fact>::operator->(&(this->super__GMonitor).super_Monitor.target)->
             super__Fact;
  this_01 = _Fact::get_goal(this_00);
  sol._M_node = (_List_node_base *)(*Now)();
  std::_List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>::
  _List_const_iterator(&local_28);
  local_38._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
       ::begin(&(this->super__GMonitor).sim_failures.mandatory_solutions);
  std::_List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>::
  _List_const_iterator(&local_30,&local_38);
  local_28._M_node = local_30._M_node;
  do {
    local_48._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
         ::end(&(this->super__GMonitor).sim_failures.mandatory_solutions);
    std::_List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>::
    _List_const_iterator(&local_40,&local_48);
    bVar1 = std::operator!=(&local_28,&local_40);
    if (!bVar1) {
      local_58._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
           ::begin(&(this->super__GMonitor).sim_failures.optional_solutions);
      std::_List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>::
      _List_const_iterator(&local_50,&local_58);
      local_28._M_node = local_50._M_node;
      while( true ) {
        best_sol = (Sim *)std::__cxx11::
                          list<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
                          ::end(&(this->super__GMonitor).sim_failures.optional_solutions);
        std::_List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>::
        _List_const_iterator(&local_60,(iterator *)&best_sol);
        bVar1 = std::operator!=(&local_28,&local_60);
        if (!bVar1) break;
        ppVar4 = std::_List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>
                 ::operator*(&local_28);
        pSVar5 = core::P<r_exec::Sim>::operator->(&ppVar4->second);
        bVar1 = Sim::is_invalidated(pSVar5);
        if (!bVar1) {
          ppVar4 = std::
                   _List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>::
                   operator*(&local_28);
          pGVar2 = core::P<r_exec::Goal>::operator->(&ppVar4->first);
          dVar10 = Goal::get_strength(pGVar2,(uint64_t)sol._M_node);
          dVar11 = Goal::get_strength(this_01,(uint64_t)sol._M_node);
          if (dVar11 < dVar10) {
            ppVar4 = std::
                     _List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>
                     ::operator*(&local_28);
            pSVar5 = core::P<r_exec::Sim>::operator->(&ppVar4->second);
            Sim::invalidate(pSVar5);
          }
        }
        std::_List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>::
        operator++(&local_28);
      }
      local_70 = (Sim *)0x0;
      local_80._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
           ::begin(&(this->super__GMonitor).sim_successes.optional_solutions);
      std::_List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>::
      _List_const_iterator(&local_78,&local_80);
      local_28._M_node = local_78._M_node;
      while( true ) {
        s = (double)std::__cxx11::
                    list<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
                    ::end(&(this->super__GMonitor).sim_successes.optional_solutions);
        std::_List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>::
        _List_const_iterator(&local_88,(iterator *)&s);
        bVar1 = std::operator!=(&local_28,&local_88);
        if (!bVar1) break;
        ppVar4 = std::_List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>
                 ::operator*(&local_28);
        pSVar5 = core::P<r_exec::Sim>::operator->(&ppVar4->second);
        bVar1 = Sim::is_invalidated(pSVar5);
        if (!bVar1) {
          if (local_70 == (Sim *)0x0) {
            ppVar4 = std::
                     _List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>
                     ::operator*(&local_28);
            local_70 = core::P::operator_cast_to_Sim_((P *)&ppVar4->second);
          }
          else {
            ppVar4 = std::
                     _List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>
                     ::operator*(&local_28);
            pSVar5 = core::P<r_exec::Sim>::operator->(&ppVar4->second);
            dVar10 = pSVar5->sol_cfd;
            ppVar4 = std::
                     _List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>
                     ::operator*(&local_28);
            pSVar5 = core::P<r_exec::Sim>::operator->(&ppVar4->second);
            lVar3 = pSVar5->sol_before - (long)sol._M_node;
            auVar12._8_4_ = (int)((ulong)lVar3 >> 0x20);
            auVar12._0_8_ = lVar3;
            auVar12._12_4_ = 0x45300000;
            _s = dVar10 / ((auVar12._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0));
            lVar3 = local_70->sol_before - (long)sol._M_node;
            auVar13._8_4_ = (int)((ulong)lVar3 >> 0x20);
            auVar13._0_8_ = lVar3;
            auVar13._12_4_ = 0x45300000;
            local_a0 = local_70->sol_cfd /
                       ((auVar13._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0));
            if (local_a0 < _s) {
              ppVar4 = std::
                       _List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>
                       ::operator*(&local_28);
              local_70 = core::P::operator_cast_to_Sim_((P *)&ppVar4->second);
            }
          }
        }
        std::_List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>::
        operator++(&local_28);
      }
      _GMonitor::invalidate_sim_outcomes(&this->super__GMonitor);
      if (local_70 != (Sim *)0x0) {
        ppVar4 = std::_List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>
                 ::operator*(&local_28);
        pSVar5 = core::P<r_exec::Sim>::operator->(&ppVar4->second);
        pPVar6 = core::P::operator_cast_to_PrimaryMDLController_((P *)&pSVar5->sol);
        pHVar7 = core::P::operator_cast_to_HLPBindingMap_
                           ((P *)&(this->super__GMonitor).super_Monitor.bindings);
        pFVar8 = core::P::operator_cast_to_Fact_((P *)&local_70->super_goal);
        bVar1 = local_70->opposite;
        fVar9 = _Fact::get_cfd((this->super__GMonitor).goal_target);
        PrimaryMDLController::abduce(pPVar6,pHVar7,pFVar8,(bool)(bVar1 & 1),(double)fVar9);
        local_b0._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
             ::begin(&(this->super__GMonitor).sim_successes.mandatory_solutions);
        std::_List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>::
        _List_const_iterator(&local_a8,&local_b0);
        local_28._M_node = local_a8._M_node;
        while( true ) {
          local_c0._M_node =
               (_List_node_base *)
               std::__cxx11::
               list<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
               ::end(&(this->super__GMonitor).sim_successes.mandatory_solutions);
          std::_List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>::
          _List_const_iterator(&local_b8,&local_c0);
          bVar1 = std::operator!=(&local_28,&local_b8);
          if (!bVar1) break;
          ppVar4 = std::
                   _List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>::
                   operator*(&local_28);
          pSVar5 = core::P<r_exec::Sim>::operator->(&ppVar4->second);
          pPVar6 = core::P::operator_cast_to_PrimaryMDLController_((P *)&pSVar5->sol);
          pHVar7 = core::P::operator_cast_to_HLPBindingMap_
                             ((P *)&(this->super__GMonitor).super_Monitor.bindings);
          ppVar4 = std::
                   _List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>::
                   operator*(&local_28);
          pSVar5 = core::P<r_exec::Sim>::operator->(&ppVar4->second);
          pFVar8 = core::P::operator_cast_to_Fact_((P *)&pSVar5->super_goal);
          ppVar4 = std::
                   _List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>::
                   operator*(&local_28);
          pSVar5 = core::P<r_exec::Sim>::operator->(&ppVar4->second);
          bVar1 = pSVar5->opposite;
          fVar9 = _Fact::get_cfd((this->super__GMonitor).goal_target);
          PrimaryMDLController::abduce(pPVar6,pHVar7,pFVar8,(bool)(bVar1 & 1),(double)fVar9);
          std::_List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>::
          operator++(&local_28);
        }
      }
      return;
    }
    ppVar4 = std::_List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>::
             operator*(&local_28);
    pSVar5 = core::P<r_exec::Sim>::operator->(&ppVar4->second);
    bVar1 = Sim::is_invalidated(pSVar5);
    if (!bVar1) {
      ppVar4 = std::_List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>::
               operator*(&local_28);
      pGVar2 = core::P<r_exec::Goal>::operator->(&ppVar4->first);
      dVar10 = Goal::get_strength(pGVar2,(uint64_t)sol._M_node);
      dVar11 = Goal::get_strength(this_01,(uint64_t)sol._M_node);
      if (dVar11 < dVar10) {
        _GMonitor::invalidate_sim_outcomes(&this->super__GMonitor);
        return;
      }
    }
    std::_List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>::operator++
              (&local_28);
  } while( true );
}

Assistant:

void GMonitor::commit()   // the purpose is to invalidate damaging simulations; if anything remains, commit to all mandatory simulations and to the best optional one.
{
    Goal *monitored_goal = target->get_goal();
    uint64_t now = Now();
    SolutionList::const_iterator sol;

    for (sol = sim_failures.mandatory_solutions.begin(); sol != sim_failures.mandatory_solutions.end(); ++sol) { // check if any mandatory solution could result in the failure of more important a goal.
        if ((*sol).second->is_invalidated()) {
            continue;
        }

        if ((*sol).first->get_strength(now) > monitored_goal->get_strength(now)) { // cave in.
            invalidate_sim_outcomes(); // this stops any further propagation of the goal simulation.
            return;
        }
    }

    for (sol = sim_failures.optional_solutions.begin(); sol != sim_failures.optional_solutions.end(); ++sol) { // check if any optional solutions could result in the failure of more important a goal; invalidate the culprits.
        if ((*sol).second->is_invalidated()) {
            continue;
        }

        if ((*sol).first->get_strength(now) > monitored_goal->get_strength(now)) {
            (*sol).second->invalidate();
        }
    }

    Sim *best_sol = nullptr;

    for (sol = sim_successes.optional_solutions.begin(); sol != sim_successes.optional_solutions.end(); ++sol) { // find the best optional solution left.
        if ((*sol).second->is_invalidated()) {
            continue;
        }

        if (!best_sol) {
            best_sol = (*sol).second;
        } else {
            double s = (*sol).second->sol_cfd / ((*sol).second->sol_before - now);
            double _s = best_sol->sol_cfd / (best_sol->sol_before - now);

            if (s > _s) {
                best_sol = (*sol).second;
            }
        }
    }

    invalidate_sim_outcomes(); // this stops any further propagation of the goal simulation.

    if (best_sol) {
        ((PrimaryMDLController *)(*sol).second->sol)->abduce(bindings, best_sol->super_goal, best_sol->opposite, goal_target->get_cfd());

        for (sol = sim_successes.mandatory_solutions.begin(); sol != sim_successes.mandatory_solutions.end(); ++sol) { // commit to all mandatory solutions.
            ((PrimaryMDLController *)(*sol).second->sol)->abduce(bindings, (*sol).second->super_goal, (*sol).second->opposite, goal_target->get_cfd());
        }
    }
}